

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

bool __thiscall GCSFilter::MatchInternal(GCSFilter *this,uint64_t *element_hashes,size_t size)

{
  Span<const_unsigned_char> data;
  uint64_t uVar1;
  long in_RDX;
  long in_RSI;
  Span<const_unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  uint64_t delta;
  uint32_t i;
  size_t hashes_index;
  uint64_t value;
  uint64_t N;
  BitStreamReader<SpanReader> bitreader;
  SpanReader stream;
  BitStreamReader<SpanReader> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  uint64_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar2;
  long local_70;
  ulong local_68;
  bool local_39;
  undefined1 in_stack_fffffffffffffff7;
  SpanReader *is;
  
  is = *(SpanReader **)(in_FS_OFFSET + 0x28);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_RDI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  data.m_data._7_1_ = in_stack_ffffffffffffff77;
  data.m_data._0_7_ = in_stack_ffffffffffffff70;
  data.m_size = (size_t)in_RDI;
  SpanReader::SpanReader((SpanReader *)in_stack_ffffffffffffff68,data);
  uVar1 = ReadCompactSize<SpanReader>(is,(bool)in_stack_fffffffffffffff7);
  if (uVar1 != (uint)in_RDI[1].m_size) {
    __assert_fail("N == m_N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockfilter.cpp"
                  ,0x6d,"bool GCSFilter::MatchInternal(const uint64_t *, size_t) const");
  }
  BitStreamReader<SpanReader>::BitStreamReader(in_stack_ffffffffffffff68,(SpanReader *)0x8c137a);
  local_68 = 0;
  local_70 = 0;
  uVar2 = 0;
  do {
    if ((uint)in_RDI[1].m_size <= uVar2) {
      local_39 = false;
LAB_008c143e:
      if (*(SpanReader **)(in_FS_OFFSET + 0x28) == is) {
        return local_39;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffff80 =
         GolombRiceDecode<SpanReader>
                   ((BitStreamReader<SpanReader> *)CONCAT44(uVar2,in_stack_ffffffffffffff88),
                    (uint8_t)(in_stack_ffffffffffffff80 >> 0x38));
    local_68 = in_stack_ffffffffffffff80 + local_68;
    while( true ) {
      if (local_70 == in_RDX) {
        local_39 = false;
        goto LAB_008c143e;
      }
      if (*(ulong *)(in_RSI + local_70 * 8) == local_68) {
        local_39 = true;
        goto LAB_008c143e;
      }
      if (local_68 < *(ulong *)(in_RSI + local_70 * 8)) break;
      local_70 = local_70 + 1;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool GCSFilter::MatchInternal(const uint64_t* element_hashes, size_t size) const
{
    SpanReader stream{m_encoded};

    // Seek forward by size of N
    uint64_t N = ReadCompactSize(stream);
    assert(N == m_N);

    BitStreamReader bitreader{stream};

    uint64_t value = 0;
    size_t hashes_index = 0;
    for (uint32_t i = 0; i < m_N; ++i) {
        uint64_t delta = GolombRiceDecode(bitreader, m_params.m_P);
        value += delta;

        while (true) {
            if (hashes_index == size) {
                return false;
            } else if (element_hashes[hashes_index] == value) {
                return true;
            } else if (element_hashes[hashes_index] > value) {
                break;
            }

            hashes_index++;
        }
    }

    return false;
}